

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

int musig_vectors_keyagg_and_tweak
              (MUSIG_ERROR *error,secp256k1_musig_keyagg_cache *keyagg_cache,uchar *agg_pk_ser,
              uchar (*pubkeys33) [33],uchar (*tweaks32) [32],size_t key_indices_len,
              size_t *key_indices,size_t tweak_indices_len,size_t *tweak_indices,int *is_xonly)

{
  int iVar1;
  long in_RDX;
  undefined4 *in_RDI;
  int in_R9D;
  secp256k1_pubkey **unaff_retaddr;
  secp256k1_musig_keyagg_cache *in_stack_00000008;
  secp256k1_xonly_pubkey agg_pk_xonly;
  secp256k1_pubkey agg_pk;
  int i;
  secp256k1_pubkey *pk_ptr [7];
  secp256k1_pubkey pubkeys [7];
  uchar *in_stack_fffffffffffffd38;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffd40;
  secp256k1_pubkey *in_stack_fffffffffffffd48;
  secp256k1_context *in_stack_fffffffffffffd50;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffd88;
  secp256k1_pubkey *in_stack_fffffffffffffd90;
  secp256k1_context *in_stack_fffffffffffffd98;
  secp256k1_pubkey *in_stack_fffffffffffffda0;
  secp256k1_context *in_stack_fffffffffffffda8;
  int local_23c;
  long local_238 [8];
  undefined1 local_1f8 [32];
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffe28;
  secp256k1_pubkey *in_stack_fffffffffffffe30;
  secp256k1_context *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  for (local_23c = 0; local_23c < in_R9D; local_23c = local_23c + 1) {
    iVar1 = secp256k1_ec_pubkey_parse
                      (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                       (uchar *)in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
    if (iVar1 == 0) {
      *in_RDI = 0;
      return 0;
    }
    local_238[local_23c] = (long)(local_1f8 + (long)local_23c * 0x40);
  }
  iVar1 = secp256k1_musig_pubkey_agg
                    ((secp256k1_context *)agg_pk_xonly.data._12_8_,
                     (secp256k1_xonly_pubkey *)agg_pk_xonly.data._4_8_,in_stack_00000008,
                     unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    *in_RDI = 7;
    iVar1 = 0;
  }
  else {
    for (local_23c = 0; local_23c < agg_pk_xonly.data._4_4_; local_23c = local_23c + 1) {
      if (*(int *)(agg_pk_xonly.data._20_8_ + (long)local_23c * 4) == 0) {
        iVar1 = secp256k1_musig_pubkey_ec_tweak_add
                          (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                           in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        if (iVar1 == 0) {
          *in_RDI = 1;
          return 0;
        }
      }
      else {
        iVar1 = secp256k1_musig_pubkey_xonly_tweak_add
                          (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                           in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        if (iVar1 == 0) {
          *in_RDI = 1;
          return 0;
        }
      }
    }
    iVar1 = secp256k1_musig_pubkey_get
                      (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                      );
    if (iVar1 == 0) {
      *in_RDI = 7;
      iVar1 = 0;
    }
    else {
      iVar1 = secp256k1_xonly_pubkey_from_pubkey
                        (in_stack_fffffffffffffda8,
                         (secp256k1_xonly_pubkey *)in_stack_fffffffffffffda0,
                         (int *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      if (iVar1 == 0) {
        *in_RDI = 7;
        iVar1 = 0;
      }
      else if ((in_RDX == 0) ||
              (iVar1 = secp256k1_xonly_pubkey_serialize
                                 (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90->data,
                                  in_stack_fffffffffffffd88), iVar1 != 0)) {
        iVar1 = 1;
      }
      else {
        *in_RDI = 7;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int musig_vectors_keyagg_and_tweak(enum MUSIG_ERROR *error,
                                   secp256k1_musig_keyagg_cache *keyagg_cache,
                                   unsigned char *agg_pk_ser,
                                   const unsigned char pubkeys33[][33],
                                   const unsigned char tweaks32[][32],
                                   size_t key_indices_len,
                                   const size_t *key_indices,
                                   size_t tweak_indices_len,
                                   const size_t *tweak_indices,
                                   const int *is_xonly) {
    secp256k1_pubkey pubkeys[MUSIG_VECTORS_MAX_PUBKEYS];
    const secp256k1_pubkey *pk_ptr[MUSIG_VECTORS_MAX_PUBKEYS];
    int i;
    secp256k1_pubkey agg_pk;
    secp256k1_xonly_pubkey agg_pk_xonly;

    for (i = 0; i < (int)key_indices_len; i++) {
        if (!secp256k1_ec_pubkey_parse(CTX, &pubkeys[i], pubkeys33[key_indices[i]], 33)) {
            *error = MUSIG_PUBKEY;
            return 0;
        }
        pk_ptr[i] = &pubkeys[i];
    }
    if (!secp256k1_musig_pubkey_agg(CTX, NULL, keyagg_cache, pk_ptr, key_indices_len)) {
        *error = MUSIG_OTHER;
        return 0;
    }

    for (i = 0; i < (int)tweak_indices_len; i++) {
        if (is_xonly[i]) {
            if (!secp256k1_musig_pubkey_xonly_tweak_add(CTX, NULL, keyagg_cache, tweaks32[tweak_indices[i]])) {
                *error = MUSIG_TWEAK;
                return 0;
            }
        } else {
            if (!secp256k1_musig_pubkey_ec_tweak_add(CTX, NULL, keyagg_cache, tweaks32[tweak_indices[i]])) {
                *error = MUSIG_TWEAK;
                return 0;
            }
        }
    }
    if (!secp256k1_musig_pubkey_get(CTX, &agg_pk, keyagg_cache)) {
        *error = MUSIG_OTHER;
        return 0;
    }

    if (!secp256k1_xonly_pubkey_from_pubkey(CTX, &agg_pk_xonly, NULL, &agg_pk)) {
        *error = MUSIG_OTHER;
        return 0;
    }

    if (agg_pk_ser != NULL) {
        if (!secp256k1_xonly_pubkey_serialize(CTX, agg_pk_ser, &agg_pk_xonly)) {
            *error = MUSIG_OTHER;
            return 0;
        }
    }

    return 1;
}